

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O2

int dfft_create_execution_flow(dfft_plan *plan)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  uVar1 = plan->ndim;
  piVar3 = (int *)malloc((long)(int)uVar1 << 2);
  plan->depth = piVar3;
  plan->max_depth = 0;
  uVar8 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    iVar2 = plan->gdim[uVar6] / plan->pdim[uVar6];
    uVar4 = 0;
    if (1 < iVar2) {
      uVar4 = 0;
      for (iVar7 = plan->k0[uVar6]; iVar7 <= plan->pdim[uVar6]; iVar7 = iVar7 * iVar2) {
        uVar4 = uVar4 + 1;
      }
    }
    piVar3[uVar6] = uVar4;
    if ((int)uVar8 < (int)uVar4) {
      plan->max_depth = uVar4;
      uVar8 = uVar4;
    }
  }
  if (uVar8 != 0) {
    piVar3 = (int *)malloc((long)(int)uVar8 << 2);
    plan->n_fft = piVar3;
  }
  for (uVar5 = (ulong)uVar8; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    plan->n_fft[uVar5 - 1] = uVar1;
  }
  plan->final_multi = 0;
  return 0;
}

Assistant:

int dfft_create_execution_flow(dfft_plan *plan)
    {
    /* compute depth of parallel fft (number of redistributions/dimension) */
    plan->depth = malloc(sizeof(int)*plan->ndim);
    plan->max_depth = 0;
    int i,d,j;
    for (i=0; i< plan->ndim; ++i)
        {
        d = 0;
        int p = plan->pdim[i];
        int l = plan->gdim[i]/p;
        if (l > 1)
            {
            for (j = plan->k0[i]; j <= p; j*=l)
                d++;
            }
        plan->depth[i] = d;
        if (d > plan->max_depth) plan->max_depth = d;
        }

    if (plan->max_depth)
        plan->n_fft = (int *)malloc(sizeof(int)*plan->max_depth);

    /* we always decompose into 1d FFTs when the backend doesn't support
     * multidimensional */
    int decompose_1d = 1 ;
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        #ifdef CUDA_FFT_SUPPORTS_MULTI
        decompose_1d = ((plan->ndim > CUDA_FFT_MAX_N) ? 1 : 0);
        #else
        decompose_1d = 1;
        #endif

        }
    else
    #endif
        {
        #ifdef HOST_FFT_SUPPORTS_MULTI
        decompose_1d = 0;
        #else
        decompose_1d = 1;
        #endif
        }

    /* allocate plans */
    #ifdef ENABLE_CUDA
    if (plan->device)
        {
        if (plan->max_depth)
            {
            plan->cuda_plans_multi_fw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
            plan->cuda_plans_multi_bw =
                (cuda_plan_t **)malloc(sizeof(cuda_plan_t *)*plan->max_depth);
           }
        }
    #endif

    /* now create plans for every level, except the lowest */
    /* this is a general 'vector-radix' implementation */
    for (d = plan->max_depth-1; d >= 0; d--)
        {
        /* count number of ffts at this level in all dimensions */
        int n = 0;
        for (i = 0; i < plan->ndim; ++i)
            if (plan->depth[i] > d) n++;

        if (n < plan->ndim || decompose_1d)
            {
            /* 1D FFT for all 'active' dimensions, transposing as we go */
            plan->n_fft[d] = plan->ndim;

            /* allocate ndim plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
                }
            #endif

            for (i = 0; i< plan->ndim; ++i)
                {
                int istride = plan->size_in/plan->inembed[i];
                int ostride = 1;
                int idist = 1;
                int odist = plan->inembed[i];
                int howmany = plan->size_in/plan->inembed[i];

                /* if at this level, there is no planned FFT along the current
                 * dimension, just proceed  */
                int dim;
                if (plan->depth[i] > d)
                    {
                    dim = plan->gdim[i]/plan->pdim[i];

                    #ifdef ENABLE_CUDA
                    if (plan->device)
                        {
                        int res;
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_fw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 0);
                        CHECK_PLAN_CREATE(res);
                        res = dfft_cuda_create_1d_plan(&plan->cuda_plans_multi_bw[d][i],
                            dim, howmany, istride, idist, ostride, odist, 1);
                        CHECK_PLAN_CREATE(res);
                        }
                    #endif
                    }
                }
            }
        else
            {
            /* all dimensions have equal length, use multidimensinoal FFT */
            plan->n_fft[d] = 1;

            /* allocate plan */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                plan->cuda_plans_multi_fw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                plan->cuda_plans_multi_bw[d] =
                    (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
                }
            #endif

            int *dim = malloc(sizeof(int)*plan->ndim);
            for (i = 0; i < plan->ndim; ++i)
                dim[i] = plan->gdim[i]/plan->pdim[i];

            int howmany = 1;
            /* create multidimensional forward and backward plans */
            #ifdef ENABLE_CUDA
            if (plan->device)
                {
                int res;
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_fw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 0);
                CHECK_PLAN_CREATE(res);
                res = dfft_cuda_create_nd_plan(&plan->cuda_plans_multi_bw[d][0],
                    plan->ndim, dim, howmany,
                    plan->inembed, 1, 1, plan->inembed, 1, 1, 1);
                CHECK_PLAN_CREATE(res);
                }
            #endif
            free(dim);
            }
        } /* end loop over levels */

    /* create plans for final stage */
    plan->final_multi = 1;
    if (decompose_1d)
        {
        plan->final_multi = 0;
        }
    else
        {
        /* find out if we are doing a full FFT in every dimension */
        for (i = 0; i < plan->ndim; ++i)
            if (! (plan->k0[i] == plan->gdim[i]/plan->pdim[i]))
                {
                plan->final_multi = 0;
                break;
                }
        }

    if (!plan->final_multi)
        {
        /* again, we proceed by doing partial 1d FFTs dimension-wise,
         * in between we have to transpose */

        /* allocate plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t)*plan->ndim);
            }
        #endif

        int size = plan->size_in;
        for (i = 0; i < plan->ndim; ++i)
            {
            int s = size/plan->inembed[i] *(plan->gdim[i]/plan->pdim[i]);
            int dim = plan->k0[i];
            int howmany = s/(plan->k0[i]);
            int istride = s/(plan->k0[i]);
            int idist = 1;
            int ostride = s/(plan->k0[i]);
            int odist = 1;

            #ifdef ENABLE_CUDA
            int res;
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_fw[i],
                dim, howmany, istride, idist, ostride, odist, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_1d_plan(&plan->cuda_plans_final_bw[i],
                dim, howmany, istride, idist, ostride, odist, 1);
            CHECK_PLAN_CREATE(res);
            #endif

            /* this time, we change to the output embedding */
            size /= plan->inembed[i];
            size *= plan->oembed[i];
            }
        }
    else
        {
        /* the final stage is a multidimensional transform */
        /* allocate plan */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            plan->cuda_plans_final_fw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            plan->cuda_plans_final_bw =
                (cuda_plan_t *)malloc(sizeof(cuda_plan_t));
            }
        #endif

        int *dim = malloc(sizeof(int)*plan->ndim);
        for (i = 0; i < plan->ndim; ++i)
            dim[i] = plan->gdim[i]/plan->pdim[i];

        int howmany = 1;
        /* create multidimensional forward and backward plans */
        #ifdef ENABLE_CUDA
        if (plan->device)
            {
            int res;
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_fw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 0);
            CHECK_PLAN_CREATE(res);
            res = dfft_cuda_create_nd_plan(&plan->cuda_plans_final_bw[0],
                plan->ndim, dim, howmany,
                plan->inembed, 1, 1, plan->oembed, 1, 1, 1);
            CHECK_PLAN_CREATE(res);
            }
        #endif
        free(dim);
        }
    return 0;
    }